

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_ref(lua_State *L,int t)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Unsigned lVar4;
  
  iVar2 = -1;
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
  }
  else {
    iVar1 = lua_absindex(L,t);
    iVar2 = lua_rawgeti(L,iVar1,1);
    if (iVar2 == 3) {
      lVar3 = lua_tointegerx(L,-1,(int *)0x0);
      iVar2 = (int)lVar3;
    }
    else {
      iVar2 = 0;
      lua_pushinteger(L,0);
      lua_rawseti(L,iVar1,1);
    }
    lua_settop(L,-2);
    if (iVar2 == 0) {
      lVar4 = lua_rawlen(L,iVar1);
      iVar2 = (int)lVar4 + 1;
    }
    else {
      lua_rawgeti(L,iVar1,(long)iVar2);
      lua_rawseti(L,iVar1,1);
    }
    lua_rawseti(L,iVar1,(long)iVar2);
  }
  return iVar2;
}

Assistant:

LUALIB_API int luaL_ref (lua_State *L, int t) {
  int ref;
  if (lua_isnil(L, -1)) {
    lua_pop(L, 1);  /* remove from stack */
    return LUA_REFNIL;  /* 'nil' has a unique fixed reference */
  }
  t = lua_absindex(L, t);
  if (lua_rawgeti(L, t, 1) == LUA_TNUMBER)  /* already initialized? */
    ref = (int)lua_tointeger(L, -1);  /* ref = t[1] */
  else {  /* first access */
    lua_assert(!lua_toboolean(L, -1));  /* must be nil or false */
    ref = 0;  /* list is empty */
    lua_pushinteger(L, 0);  /* initialize as an empty list */
    lua_rawseti(L, t, 1);  /* ref = t[1] = 0 */
  }
  lua_pop(L, 1);  /* remove element from stack */
  if (ref != 0) {  /* any free element? */
    lua_rawgeti(L, t, ref);  /* remove it from list */
    lua_rawseti(L, t, 1);  /* (t[1] = t[ref]) */
  }
  else  /* no free elements */
    ref = (int)lua_rawlen(L, t) + 1;  /* get a new reference */
  lua_rawseti(L, t, ref);
  return ref;
}